

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int Connectubloxx(UBLOX *publox,char *szCfgFilePath)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  char *szCfgFilePath_local;
  UBLOX *publox_local;
  
  local_24 = 0;
  do {
    if (addrsublox[local_24] == (void *)0x0) {
      iVar1 = Connectublox(publox,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsublox[local_24] = publox;
      return 0;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int Connectubloxx(UBLOX* publox, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsublox[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = Connectublox(publox, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsublox[id] = publox;

	return EXIT_SUCCESS;
}